

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void json::Json::nextValue(Array *array,Node *VS)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  Production *pPVar3;
  const_reference pvVar4;
  Token *pTVar5;
  JsonError *pJVar6;
  size_type sVar7;
  Node *nextVS;
  string local_270;
  double local_250;
  double d;
  int64_t i;
  string local_238;
  Array local_218;
  Object local_1e8;
  stringstream local_1b0 [8];
  stringstream s;
  Node *uv;
  Node *V;
  Node *VS_local;
  Array *array_local;
  
  pPVar3 = parser::Node::getProduction(VS);
  pvVar4 = std::vector<parser::Node,_std::allocator<parser::Node>_>::at(&pPVar3->nodes,0);
  pPVar3 = parser::Node::getProduction(pvVar4);
  pvVar4 = std::vector<parser::Node,_std::allocator<parser::Node>_>::at(&pPVar3->nodes,0);
  pTVar5 = parser::Node::getToken(pvVar4);
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1b0,(string *)&pTVar5->value,_Var2);
  bVar1 = parser::Node::isProduction(pvVar4);
  if (bVar1) {
    pPVar3 = parser::Node::getProduction(pvVar4);
    if (pPVar3->nonTerminal == 2) {
      createObject(&local_1e8,pvVar4);
      Array::operator()(array,&local_1e8);
      Object::~Object(&local_1e8);
    }
    else {
      pPVar3 = parser::Node::getProduction(pvVar4);
      if (pPVar3->nonTerminal != 3) {
        i._6_1_ = 1;
        pJVar6 = (JsonError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_238,"invalid format",(allocator<char> *)((long)&i + 7));
        JsonError::JsonError(pJVar6,&local_238);
        i._6_1_ = 0;
        __cxa_throw(pJVar6,&JsonError::typeinfo,JsonError::~JsonError);
      }
      createArray(&local_218,pvVar4);
      Array::operator()(array,&local_218);
      Array::~Array(&local_218);
    }
  }
  else {
    pTVar5 = parser::Node::getToken(pvVar4);
    if (pTVar5->tokenId == 6) {
      d = 0.0;
      std::istream::operator>>(local_1b0,(long *)&d);
      Array::operator()(array,(int64_t)d);
    }
    else {
      pTVar5 = parser::Node::getToken(pvVar4);
      if (pTVar5->tokenId == 8) {
        pTVar5 = parser::Node::getToken(pvVar4);
        Array::operator()(array,&pTVar5->value);
      }
      else {
        pTVar5 = parser::Node::getToken(pvVar4);
        if (pTVar5->tokenId == 7) {
          local_250 = 0.0;
          std::istream::operator>>(local_1b0,&local_250);
          Array::operator()(array,local_250);
        }
        else {
          pTVar5 = parser::Node::getToken(pvVar4);
          if (pTVar5->tokenId != 9) {
            nextVS._6_1_ = 1;
            pJVar6 = (JsonError *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_270,"invalid format",(allocator<char> *)((long)&nextVS + 7))
            ;
            JsonError::JsonError(pJVar6,&local_270);
            nextVS._6_1_ = 0;
            __cxa_throw(pJVar6,&JsonError::typeinfo,JsonError::~JsonError);
          }
          pTVar5 = parser::Node::getToken(pvVar4);
          bVar1 = std::operator==(&pTVar5->value,"true");
          Array::operator()(array,bVar1);
        }
      }
    }
  }
  pPVar3 = parser::Node::getProduction(VS);
  sVar7 = std::vector<parser::Node,_std::allocator<parser::Node>_>::size(&pPVar3->nodes);
  if (1 < sVar7) {
    pPVar3 = parser::Node::getProduction(VS);
    pvVar4 = std::vector<parser::Node,_std::allocator<parser::Node>_>::at(&pPVar3->nodes,2);
    nextValue(array,pvVar4);
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return;
}

Assistant:

static void nextValue(Array& array, parser::Node const& VS) {
            parser::Node const& V = VS.getProduction().nodes.at(0);

            parser::Node const& uv = V.getProduction().nodes.at(0);

            std::stringstream s(uv.getToken().value);

            if (uv.isProduction()) {
                if (uv.getProduction().nonTerminal == rules::Object) {
                    array(createObject(uv));
                } else if (uv.getProduction().nonTerminal == rules::Array) {
                    array(createArray(uv));
                } else {
                    throw JsonError("invalid format");
                }
            } else {
                if (uv.getToken().tokenId == rules::Integer) {
                    int64_t i = 0;
                    s >> i;
                    array(i);
                } else if (uv.getToken().tokenId == rules::String) {
                    array(uv.getToken().value);
                } else if (uv.getToken().tokenId == rules::Float) {
                    double d = 0;
                    s >> d;
                    array(d);
                } else if (uv.getToken().tokenId == rules::Bool) {
                    array(uv.getToken().value == "true");
                } else {
                    throw JsonError("invalid format");
                }
            }

            if (VS.getProduction().nodes.size() > 1) {
                parser::Node const& nextVS = VS.getProduction().nodes.at(2);
                nextValue(array, nextVS);
            }
        }